

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_13::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  pointer ppGVar3;
  ElemSegment *pEVar4;
  pointer pVVar5;
  pointer ppDVar6;
  DataSegment *pDVar7;
  pointer ppVVar8;
  ulong uVar9;
  ExprVisitor *pEVar10;
  pointer ppDVar11;
  Var *var;
  pointer ppFVar12;
  pointer ppEVar13;
  pointer var_00;
  pointer ppGVar14;
  pointer ppVVar15;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  ExprVisitor *local_50;
  ExprVisitor *local_48;
  ExprVisitor *local_40;
  Module *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->func_type_bindings,"function type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->except_bindings,"except");
  ppFVar12 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = module;
  if (ppFVar12 != ppFVar1) {
    local_40 = &this->visitor_;
    do {
      func = *ppFVar12;
      this->current_func_ = func;
      if ((func->decl).has_func_type == true) {
        ResolveVar(this,&this->current_module_->func_type_bindings,&(func->decl).type_var,
                   "function type");
      }
      local_58 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
                 ::_M_manager;
      local_70._M_unused._0_8_ = (undefined8)func;
      local_70._8_8_ = this;
      BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      ExprVisitor::VisitFunc(local_40,func);
      this->current_func_ = (Func *)0x0;
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 != ppFVar1);
  }
  ppEVar2 = (local_38->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar13 = (local_38->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar13 != ppEVar2; ppEVar13 = ppEVar13 + 1) {
    uVar9 = (ulong)(*ppEVar13)->kind;
    if (uVar9 < 5) {
      ResolveVar(this,(BindingHash *)
                      ((long)&(this->current_module_->loc).filename.data_ +
                      *(long *)(&DAT_011d6d28 + uVar9 * 8)),&(*ppEVar13)->var,
                 &DAT_011d6d50 + *(int *)(&DAT_011d6d50 + uVar9 * 4));
    }
  }
  ppGVar14 = (local_38->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (local_38->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar14 != ppGVar3) {
    do {
      ExprVisitor::VisitExprList(&this->visitor_,&(*ppGVar14)->init_expr);
      ppGVar14 = ppGVar14 + 1;
    } while (ppGVar14 != ppGVar3);
  }
  pEVar10 = (ExprVisitor *)
            (local_38->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = (ExprVisitor *)
             (local_38->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pEVar10 != local_50) {
    local_48 = &this->visitor_;
    do {
      pEVar4 = (ElemSegment *)
               (((_Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                  *)&pEVar10->delegate_)->_M_impl).super__Vector_impl_data._M_start;
      local_40 = pEVar10;
      ResolveVar(this,&this->current_module_->table_bindings,&pEVar4->table_var,"table");
      ExprVisitor::VisitExprList(local_48,&pEVar4->offset);
      pVVar5 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (var_00 = (pEVar4->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl
                    .super__Vector_impl_data._M_start; var_00 != pVVar5; var_00 = var_00 + 1) {
        ResolveVar(this,&this->current_module_->func_bindings,var_00,"function");
      }
      pEVar10 = (ExprVisitor *)&local_40->state_stack_;
    } while (pEVar10 != local_50);
  }
  ppDVar11 = (local_38->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar6 = (local_38->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar11 != ppDVar6) {
    do {
      pDVar7 = *ppDVar11;
      ResolveVar(this,&this->current_module_->memory_bindings,&pDVar7->memory_var,"memory");
      ExprVisitor::VisitExprList(&this->visitor_,&pDVar7->offset);
      ppDVar11 = ppDVar11 + 1;
    } while (ppDVar11 != ppDVar6);
  }
  ppVVar8 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppVVar15 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar15 != ppVVar8;
      ppVVar15 = ppVVar15 + 1) {
    ResolveVar(this,&this->current_module_->func_bindings,*ppVVar15,"function");
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->func_type_bindings, "function type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->except_bindings, "except");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}